

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialassetid.cpp
# Opt level: O1

void __thiscall
ConfidentialAssetId_Constractor_bytedata0_Test::TestBody
          (ConfidentialAssetId_Constractor_bytedata0_Test *this)

{
  bool bVar1;
  ConfidentialAssetId assetid;
  AssertHelper local_78 [2];
  undefined1 local_68 [16];
  ConfidentialAssetId local_58;
  ByteData local_30;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_78[0].data_ = (AssertHelperData *)local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
    cfd::core::ByteData::ByteData(&local_30,(string *)local_78);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_58,&local_30);
    if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_78[0].data_ != (AssertHelperData *)local_68) {
      operator_delete(local_78[0].data_);
    }
    local_58._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_004f3078;
    if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_58);
  testing::internal::AssertHelper::AssertHelper
            (local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialassetid.cpp"
             ,0x4d,
             "Expected: ConfidentialAssetId assetid(ByteData(\"\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_78,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper(local_78);
  if (((local_58._vptr_ConfidentialAssetId != (_func_int **)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_58._vptr_ConfidentialAssetId != (_func_int **)0x0)) {
    (**(code **)(*local_58._vptr_ConfidentialAssetId + 8))();
  }
  return;
}

Assistant:

TEST(ConfidentialAssetId, Constractor_bytedata0) {
  // 0byte
  EXPECT_THROW(ConfidentialAssetId assetid(ByteData("")), CfdException);
}